

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcreteVisitor.hh
# Opt level: O2

shared_ptr<VisitorResult> __thiscall ConcreteVisitor::visit(ConcreteVisitor *this,ASTWhere *where)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<VisitorResult> sVar2;
  shared_ptr<LogicalOperation> lop;
  shared_ptr<LogicalOperation> local_38;
  shared_ptr<VisitorResult> local_28;
  
  (**(code **)**(undefined8 **)(in_RDX + 8))(&local_38,*(undefined8 **)(in_RDX + 8),where);
  std::static_pointer_cast<LogicalOperation,VisitorResult>(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::make_shared<LogicalFilter,std::shared_ptr<LogicalOperation>&>(&local_38);
  _Var1._M_pi = local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ASTVisitor)._vptr_ASTVisitor =
       (_func_int **)
       local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this[1].super_ASTVisitor._vptr_ASTVisitor = (_func_int **)_Var1._M_pi;
  local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<LogicalOperation,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<VisitorResult>)
         sVar2.super___shared_ptr<VisitorResult,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VisitorResult> visit(ASTWhere *where) override {
        auto lop = std::static_pointer_cast<LogicalOperation>(where->getFilterOperation()->accept(this));
        return std::make_shared<LogicalFilter>(lop);
    }